

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

Gia_Sim2_t * Gia_Sim2Create(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  uint local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Sim2_t *p;
  Gia_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  pAig_local = (Gia_Man_t *)calloc(1,0x30);
  pAig_local->pName = (char *)pAig;
  pAig_local->pSpec = (char *)pPars;
  pAig_local->nRegs = pPars->nWords;
  iVar1 = pAig_local->nRegs;
  iVar2 = Gia_ManObjNum((Gia_Man_t *)pAig_local->pName);
  puVar4 = (uint *)malloc((long)(iVar1 * iVar2) << 2);
  *(uint **)&pAig_local->nObjs = puVar4;
  if (*(uint **)&pAig_local->nObjs == (uint *)0x0) {
    iVar1 = pAig_local->nRegs;
    iVar2 = Gia_ManObjNum((Gia_Man_t *)pAig_local->pName);
    Abc_Print(1,"Simulator could not allocate %.2f GB for simulation info.\n",
              ((double)iVar1 * 4.0 * (double)iVar2) / 1073741824.0);
    Gia_Sim2Delete((Gia_Sim2_t *)pAig_local);
    pAig_local = (Gia_Man_t *)0x0;
  }
  else {
    pVVar5 = Vec_IntAlloc(100);
    pAig_local->pObjs = (Gia_Obj_t *)pVVar5;
    pVVar5 = Vec_IntAlloc(100);
    pAig_local->pMuxes = (uint *)pVVar5;
    if (pPars->fVerbose != 0) {
      iVar2 = Gia_ManObjNum((Gia_Man_t *)pAig_local->pName);
      iVar1 = pAig_local->nRegs;
      iVar3 = Gia_ManObjNum((Gia_Man_t *)pAig_local->pName);
      Abc_Print(1,"Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n",
                ((double)iVar2 * 12.0) / 1048576.0,((double)iVar1 * 4.0 * (double)iVar3) / 1048576.0
               );
    }
    Gia_ManSetPhase(pAig);
    local_34 = 0;
    while( true ) {
      bVar6 = false;
      if ((int)local_34 < pAig->nObjs) {
        pGStack_30 = Gia_ManObj(pAig,local_34);
        bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pGStack_30->Value = local_34;
      local_34 = local_34 + 1;
    }
  }
  return (Gia_Sim2_t *)pAig_local;
}

Assistant:

Gia_Sim2_t * Gia_Sim2Create( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Gia_Sim2_t, 1 );
    p->pAig      = pAig;
    p->pPars     = pPars;
    p->nWords    = pPars->nWords;
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWords * Gia_ManObjNum(p->pAig) );
    if ( !p->pDataSim  )
    { 
        Abc_Print( 1, "Simulator could not allocate %.2f GB for simulation info.\n", 
            4.0 * p->nWords * Gia_ManObjNum(p->pAig) / (1<<30) );
        Gia_Sim2Delete( p );
        return NULL;
    }
    p->vClassOld = Vec_IntAlloc( 100 );
    p->vClassNew = Vec_IntAlloc( 100 );
    if ( pPars->fVerbose )
        Abc_Print( 1, "Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 4.0*p->nWords*Gia_ManObjNum(p->pAig)/(1<<20) );
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManForEachObj( pAig, pObj, i )
        pObj->Value = i;
    return p;
}